

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

bool __thiscall DMessageBoxMenu::Responder(DMessageBoxMenu *this,event_t *ev)

{
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  
  if (ev->type == '\x01') {
LAB_0033644f:
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
    return true;
  }
  if ((ev->type != '\x04') || (ev->subtype != '\x01')) {
    bVar1 = DMenu::Responder(&this->super_DMenu,ev);
    return bVar1;
  }
  if (this->mMessageMode != 0) goto LAB_0033644f;
  iVar2 = tolower((int)ev->data1);
  if (iVar2 != 0x20) {
    if (iVar2 == 0x79) {
      pp_Var3 = (this->super_DMenu).super_DObject._vptr_DObject;
      uVar4 = 1;
      goto LAB_00336490;
    }
    if (iVar2 != 0x6e) {
      return false;
    }
  }
  pp_Var3 = (this->super_DMenu).super_DObject._vptr_DObject;
  uVar4 = 0;
LAB_00336490:
  (*pp_Var3[0xf])(this,uVar4);
  return true;
}

Assistant:

bool DMessageBoxMenu::Responder(event_t *ev)
{
	if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_KeyDown)
	{
		if (mMessageMode == 0)
		{
			int ch = tolower(ev->data1);
			if (ch == 'n' || ch == ' ') 
			{
				HandleResult(false);		
				return true;
			}
			else if (ch == 'y') 
			{
				HandleResult(true);
				return true;
			}
		}
		else
		{
			Close();
			return true;
		}
		return false;
	}
	else if (ev->type == EV_KeyDown)
	{
		Close();
		return true;
	}
	return Super::Responder(ev);
}